

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O2

void LZ4_resetStreamHC(LZ4_streamHC_t *LZ4_streamHCPtr,int compressionLevel)

{
  int iVar1;
  short sVar2;
  LZ4_streamHC_t *LZ4_streamHCPtr_1;
  
  if (((ulong)LZ4_streamHCPtr & 7) == 0 && LZ4_streamHCPtr != (LZ4_streamHC_t *)0x0) {
    memset(LZ4_streamHCPtr,0,0x40030);
  }
  iVar1 = 0xc;
  if ((uint)compressionLevel < 0xc) {
    iVar1 = compressionLevel;
  }
  sVar2 = 9;
  if (0 < compressionLevel) {
    sVar2 = (short)iVar1;
  }
  (LZ4_streamHCPtr->internal_donotuse).compressionLevel = sVar2;
  return;
}

Assistant:

void LZ4_resetStreamHC (LZ4_streamHC_t* LZ4_streamHCPtr, int compressionLevel)
{
    LZ4_initStreamHC(LZ4_streamHCPtr, sizeof(*LZ4_streamHCPtr));
    LZ4_setCompressionLevel(LZ4_streamHCPtr, compressionLevel);
}